

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

_Bool fs_stdio_remove_entry(ALLEGRO_FS_ENTRY *fp)

{
  uint32_t uVar1;
  int errnum;
  ALLEGRO_FS_ENTRY *in_RDI;
  bool bVar2;
  int err;
  ALLEGRO_FS_ENTRY_STDIO *fp_stdio;
  int in_stack_ffffffffffffffe4;
  
  uVar1 = fs_stdio_entry_mode(in_RDI);
  if ((uVar1 & 0x20) == 0) {
    uVar1 = fs_stdio_entry_mode(in_RDI);
    if ((uVar1 & 0x10) == 0) {
      al_set_errno(in_stack_ffffffffffffffe4);
      return false;
    }
    errnum = unlink((char *)in_RDI[1].vtable);
  }
  else {
    errnum = rmdir((char *)in_RDI[1].vtable);
  }
  bVar2 = errnum == 0;
  if (!bVar2) {
    __errno_location();
    al_set_errno(errnum);
  }
  return bVar2;
}

Assistant:

static bool fs_stdio_remove_entry(ALLEGRO_FS_ENTRY *fp)
{
   ALLEGRO_FS_ENTRY_STDIO *fp_stdio = (ALLEGRO_FS_ENTRY_STDIO *) fp;
   int err;

   ASSERT(fp);

   if (fs_stdio_entry_mode(fp) & ALLEGRO_FILEMODE_ISDIR) {
      err = WRAP_RMDIR(fp_stdio->abs_path);
   }
   else if (fs_stdio_entry_mode(fp) & ALLEGRO_FILEMODE_ISFILE) {
      err = WRAP_UNLINK(fp_stdio->abs_path);
   }
   else {
      al_set_errno(ENOENT);
      return false;
   }

   if (err != 0) {
      al_set_errno(errno);
      return false;
   }

   return true;
}